

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osutils.cpp
# Opt level: O2

VMemInfo * asmjit::OSUtils_GetVMemInfo(void)

{
  int iVar1;
  VMemInfo *in_RAX;
  
  if (_ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0 != (VMemInfo *)0x0) {
    return in_RAX;
  }
  iVar1 = getpagesize();
  _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0 = (VMemInfo *)(long)iVar1;
  _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_1 = (VMemInfo *)0x10000;
  if ((VMemInfo *)0x10000 < _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0) {
    _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_1 = _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0;
  }
  return _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0;
}

Assistant:

static const VMemInfo& OSUtils_GetVMemInfo() noexcept {
  static VMemInfo vmi;
  if (ASMJIT_UNLIKELY(!vmi.pageSize)) {
    size_t pageSize = ::getpagesize();
    vmi.pageSize = pageSize;
    vmi.pageGranularity = std::max<size_t>(pageSize, 65536);
  }
  return vmi;
}